

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O3

void __thiscall OpacityTextures::check(OpacityTextures *this)

{
  ostream *poVar1;
  ostream *poVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  float fVar6;
  vec4 vVar7;
  vec4 v;
  vec4 v_00;
  vec4 v_01;
  vec4 v_02;
  vec4 v_03;
  vec4 v_04;
  vec4 v_05;
  vec4 v_06;
  vec4 v_07;
  
  if ((this->super_StaticRenderTest).m_w < 10) {
LAB_0011f4eb:
    pcVar3 = "x1-1 < m_w";
    goto LAB_0011f033;
  }
  if ((this->super_StaticRenderTest).m_h < 10) {
LAB_0011f4d3:
    pcVar3 = "y1-1 < m_h";
  }
  else {
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,9,9);
    if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
       (0.01 <= ABS(vVar7.w + -1.0))) {
      poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
      poVar1 = std::operator<<(poVar1,")=");
      poVar2 = (ostream *)0x9;
LAB_0011f647:
      iVar5 = 9;
LAB_0011f73a:
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poVar2,iVar5);
    }
    else {
      if ((this->super_StaticRenderTest).m_w < 0x16) {
LAB_0011f4f7:
        pcVar3 = "x2+1 < m_w";
        goto LAB_0011f033;
      }
      if ((this->super_StaticRenderTest).m_h < 10) goto LAB_0011f4d3;
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x15,9);
      if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
         ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x15;
        goto LAB_0011f647;
      }
      if ((this->super_StaticRenderTest).m_w < 10) goto LAB_0011f4eb;
      if ((this->super_StaticRenderTest).m_h < 0x16) {
LAB_0011f4df:
        pcVar3 = "y2+1 < m_h";
        goto LAB_0011f033;
      }
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,9,0x15);
      if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
         ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x9;
LAB_0011f735:
        iVar5 = 0x15;
        goto LAB_0011f73a;
      }
      if ((this->super_StaticRenderTest).m_w < 0x16) goto LAB_0011f4f7;
      if ((this->super_StaticRenderTest).m_h < 0x16) goto LAB_0011f4df;
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x15,0x15);
      if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
         (0.01 <= ABS(vVar7.w + -1.0))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x15;
        goto LAB_0011f735;
      }
      uVar4 = 10;
      do {
        fVar6 = (float)(int)uVar4;
        if ((float)(this->super_StaticRenderTest).m_w <= fVar6) {
LAB_0011f491:
          pcVar3 = "x < m_w";
          goto LAB_0011f033;
        }
        if ((this->super_StaticRenderTest).m_h < 10) goto LAB_0011f4d3;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar4,9);
        if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
           ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)(ulong)uVar4;
          iVar5 = 9;
          goto LAB_0011eff5;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar6) goto LAB_0011f491;
        if ((this->super_StaticRenderTest).m_h < 0x16) goto LAB_0011f4df;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar4,0x15);
        if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
           ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)(ulong)uVar4;
          iVar5 = 0x15;
          goto LAB_0011eff5;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x15);
      iVar5 = 10;
LAB_0011db32:
      if ((this->super_StaticRenderTest).m_w < 10) goto LAB_0011f4eb;
      fVar6 = (float)iVar5;
      if ((float)(this->super_StaticRenderTest).m_h <= fVar6) {
LAB_0011f49d:
        pcVar3 = "y < m_h";
        goto LAB_0011f033;
      }
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,9,iVar5);
      if ((((ABS(vVar7.x) < 0.01) && (ABS(vVar7.y) < 0.01)) && (ABS(vVar7.z) < 0.01)) &&
         (ABS(vVar7.w + -1.0) < 0.01)) {
        if ((this->super_StaticRenderTest).m_w < 0x16) goto LAB_0011f4f7;
        if ((float)(this->super_StaticRenderTest).m_h <= fVar6) goto LAB_0011f49d;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x15,iVar5);
        if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
           ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)0x15;
          goto LAB_0011eff5;
        }
        iVar5 = iVar5 + 1;
        if (iVar5 == 0x15) goto code_r0x0011dc4d;
        goto LAB_0011db32;
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
      poVar1 = std::operator<<(poVar1,")=");
      poVar2 = (ostream *)0x9;
LAB_0011eff5:
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poVar2,iVar5);
    }
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
  }
LAB_0011f033:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0xbb,"virtual void OpacityTextures::check()");
code_r0x0011dc4d:
  if ((this->super_StaticRenderTest).m_w < 0xb) {
    pcVar3 = "10 < m_w";
LAB_00120734:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbc,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xb) {
    pcVar3 = "10 < m_h";
    goto LAB_00120734;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,10);
  if (((0.01 <= ABS(vVar7.x + -0.5)) || (0.01 <= ABS(vVar7.y))) ||
     ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0xa;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,10);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    vVar7.z = 0.0;
    vVar7.w = 1.0;
    vVar7.x = 0.5;
    vVar7.y = 0.0;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,vVar7);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_00120734;
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    pcVar3 = "11 < m_w";
LAB_0012075c:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbd,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xb) {
    pcVar3 = "10 < m_h";
    goto LAB_0012075c;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,10);
  if ((((0.01 <= ABS(vVar7.x + -0.5)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
     (0.01 <= ABS(vVar7.w + -1.0))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0xb;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,10);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    v.z = 0.0;
    v.w = 1.0;
    v.x = 0.5;
    v.y = 0.0;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_0012075c;
  }
  if ((this->super_StaticRenderTest).m_w < 0xb) {
    pcVar3 = "10 < m_w";
LAB_00120784:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbe,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_00120784;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,0xb);
  if (((0.01 <= ABS(vVar7.x + -0.5)) || (0.01 <= ABS(vVar7.y))) ||
     ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0xa;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,10,0xb);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    v_00.z = 0.0;
    v_00.w = 1.0;
    v_00.x = 0.5;
    v_00.y = 0.0;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v_00);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_00120784;
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    pcVar3 = "11 < m_w";
LAB_001207ac:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xbf,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_001207ac;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xb);
  if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
     ((0.01 <= ABS(vVar7.z + -0.5) || (0.01 <= ABS(vVar7.w + -1.0))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0xb;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xb);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f8000003f000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_001207ac;
  }
  if ((this->super_StaticRenderTest).m_w < 0xc) {
    pcVar3 = "11 < m_w";
LAB_001207d4:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc0,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    pcVar3 = "12 < m_h";
    goto LAB_001207d4;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xc);
  if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z + -0.5))) ||
     (0.01 <= ABS(vVar7.w + -1.0))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0xb;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xb,0xc);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f8000003f000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_001207d4;
  }
  if ((this->super_StaticRenderTest).m_w < 0xd) {
    pcVar3 = "12 < m_w";
LAB_001207fc:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc1,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_001207fc;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xc,0xb);
  if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
     ((0.01 <= ABS(vVar7.z + -0.5) || (0.01 <= ABS(vVar7.w + -1.0))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0xc;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0xc,0xb);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f8000003f000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_001207fc;
  }
  if ((this->super_StaticRenderTest).m_w < 0x1f) {
LAB_0011f51b:
    pcVar3 = "x1-1 < m_w";
    goto LAB_0011f256;
  }
  if ((this->super_StaticRenderTest).m_h < 0xb) {
LAB_0011f503:
    pcVar3 = "y1-1 < m_h";
  }
  else {
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1e,10);
    if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
       ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
      poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,30.0);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,10.0);
      poVar1 = std::operator<<(poVar1,")=");
      poVar2 = (ostream *)0x1e;
LAB_0011fc6c:
      iVar5 = 10;
LAB_0011fd5f:
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poVar2,iVar5);
    }
    else {
      if ((this->super_StaticRenderTest).m_w < 0x2b) {
LAB_0011f527:
        pcVar3 = "x2+1 < m_w";
        goto LAB_0011f256;
      }
      if ((this->super_StaticRenderTest).m_h < 0xb) goto LAB_0011f503;
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x2a,10);
      if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
         (0.01 <= ABS(vVar7.w + -1.0))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,42.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,10.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x2a;
        goto LAB_0011fc6c;
      }
      if ((this->super_StaticRenderTest).m_w < 0x1f) goto LAB_0011f51b;
      if ((this->super_StaticRenderTest).m_h < 0x17) {
LAB_0011f50f:
        pcVar3 = "y2+1 < m_h";
        goto LAB_0011f256;
      }
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1e,0x16);
      if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
         ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,30.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,22.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x1e;
LAB_0011fd5a:
        iVar5 = 0x16;
        goto LAB_0011fd5f;
      }
      if ((this->super_StaticRenderTest).m_w < 0x2b) goto LAB_0011f527;
      if ((this->super_StaticRenderTest).m_h < 0x17) goto LAB_0011f50f;
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x2a,0x16);
      if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
         ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,42.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,22.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x2a;
        goto LAB_0011fd5a;
      }
      uVar4 = 0x1f;
      do {
        fVar6 = (float)(int)uVar4;
        if ((float)(this->super_StaticRenderTest).m_w <= fVar6) {
LAB_0011f4a9:
          pcVar3 = "x < m_w";
          goto LAB_0011f256;
        }
        if ((this->super_StaticRenderTest).m_h < 0xb) goto LAB_0011f503;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar4,10);
        if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
           (0.01 <= ABS(vVar7.w + -1.0))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,10.0);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)(ulong)uVar4;
          iVar5 = 10;
          goto LAB_0011f218;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar6) goto LAB_0011f4a9;
        if ((this->super_StaticRenderTest).m_h < 0x17) goto LAB_0011f50f;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar4,0x16);
        if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
           ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,22.0);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)(ulong)uVar4;
          iVar5 = 0x16;
          goto LAB_0011f218;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x2a);
      iVar5 = 0xb;
LAB_0011e2c8:
      if ((this->super_StaticRenderTest).m_w < 0x1f) goto LAB_0011f51b;
      fVar6 = (float)iVar5;
      if ((float)(this->super_StaticRenderTest).m_h <= fVar6) {
LAB_0011f4b5:
        pcVar3 = "y < m_h";
        goto LAB_0011f256;
      }
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1e,iVar5);
      if (((ABS(vVar7.x) < 0.01) && (ABS(vVar7.y) < 0.01)) &&
         ((ABS(vVar7.z) < 0.01 && (ABS(vVar7.w + -1.0) < 0.01)))) {
        if ((this->super_StaticRenderTest).m_w < 0x2b) goto LAB_0011f527;
        if ((float)(this->super_StaticRenderTest).m_h <= fVar6) goto LAB_0011f4b5;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x2a,iVar5);
        if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
           (0.01 <= ABS(vVar7.w + -1.0))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,42.0);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)0x2a;
          goto LAB_0011f218;
        }
        iVar5 = iVar5 + 1;
        if (iVar5 == 0x16) goto code_r0x0011e3e3;
        goto LAB_0011e2c8;
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,30.0);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
      poVar1 = std::operator<<(poVar1,")=");
      poVar2 = (ostream *)0x1e;
LAB_0011f218:
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poVar2,iVar5);
    }
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
  }
LAB_0011f256:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0xc3,"virtual void OpacityTextures::check()");
code_r0x0011e3e3:
  if ((this->super_StaticRenderTest).m_w < 0x20) {
    pcVar3 = "31 < m_w";
LAB_00120824:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc4,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_00120824;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xb);
  if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y + -0.5))) ||
     ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1f);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0x1f;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xb);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    v_01.z = 0.0;
    v_01.w = 1.0;
    v_01.x = 0.0;
    v_01.y = 0.5;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v_01);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_00120824;
  }
  if ((this->super_StaticRenderTest).m_w < 0x21) {
    pcVar3 = "32 < m_w";
LAB_0012084c:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc5,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xc) {
    pcVar3 = "11 < m_h";
    goto LAB_0012084c;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xb);
  if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y + -0.5))) ||
     ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0x20;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xb);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    v_02.z = 0.0;
    v_02.w = 1.0;
    v_02.x = 0.0;
    v_02.y = 0.5;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v_02);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_0012084c;
  }
  if ((this->super_StaticRenderTest).m_w < 0x20) {
    pcVar3 = "31 < m_w";
LAB_00120874:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc6,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    pcVar3 = "12 < m_h";
    goto LAB_00120874;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xc);
  if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y + -0.5))) || (0.01 <= ABS(vVar7.z))) ||
     (0.01 <= ABS(vVar7.w + -1.0))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1f);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0x1f;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x1f,0xc);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    v_03.z = 0.0;
    v_03.w = 1.0;
    v_03.x = 0.0;
    v_03.y = 0.5;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v_03);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_00120874;
  }
  if ((this->super_StaticRenderTest).m_w < 0x21) {
    pcVar3 = "32 < m_w";
LAB_0012089c:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,199,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    pcVar3 = "12 < m_h";
    goto LAB_0012089c;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xc);
  if (((0.01 <= ABS(vVar7.x + -0.5)) || (0.01 <= ABS(vVar7.y))) ||
     ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0x20;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xc);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    v_04.z = 0.0;
    v_04.w = 1.0;
    v_04.x = 0.5;
    v_04.y = 0.0;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v_04);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_0012089c;
  }
  if ((this->super_StaticRenderTest).m_w < 0x22) {
    pcVar3 = "33 < m_w";
LAB_001208c4:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,200,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xd) {
    pcVar3 = "12 < m_h";
    goto LAB_001208c4;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x21,0xc);
  if (((0.01 <= ABS(vVar7.x + -0.5)) || (0.01 <= ABS(vVar7.y))) ||
     ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x21);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0x21;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x21,0xc);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    v_05.z = 0.0;
    v_05.w = 1.0;
    v_05.x = 0.5;
    v_05.y = 0.0;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v_05);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_001208c4;
  }
  if ((this->super_StaticRenderTest).m_w < 0x21) {
    pcVar3 = "32 < m_w";
LAB_001208ec:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                  ,0xc9,"virtual void OpacityTextures::check()");
  }
  if ((this->super_StaticRenderTest).m_h < 0xe) {
    pcVar3 = "13 < m_h";
    goto LAB_001208ec;
  }
  vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xd);
  if ((((0.01 <= ABS(vVar7.x + -0.5)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
     (0.01 <= ABS(vVar7.w + -1.0))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd);
    poVar1 = std::operator<<(poVar1,")=");
    poVar2 = (ostream *)0x20;
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x20,0xd);
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    v_06.z = 0.0;
    v_06.w = 1.0;
    v_06.x = 0.5;
    v_06.y = 0.0;
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v_06);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
    goto LAB_001208ec;
  }
  if ((this->super_StaticRenderTest).m_w < 100) {
LAB_0011f54b:
    pcVar3 = "x1-1 < m_w";
    goto LAB_0011f479;
  }
  if ((this->super_StaticRenderTest).m_h < 10) {
LAB_0011f533:
    pcVar3 = "y1-1 < m_h";
  }
  else {
    vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,99,9);
    if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
       ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
      poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,99.0);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
      poVar1 = std::operator<<(poVar1,")=");
      poVar2 = (ostream *)0x63;
LAB_001202a0:
      iVar5 = 9;
LAB_00120393:
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poVar2,iVar5);
    }
    else {
      if ((this->super_StaticRenderTest).m_w < 0x70) {
LAB_0011f557:
        pcVar3 = "x2+1 < m_w";
        goto LAB_0011f479;
      }
      if ((this->super_StaticRenderTest).m_h < 10) goto LAB_0011f533;
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6f,9);
      if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
         ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,111.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x6f;
        goto LAB_001202a0;
      }
      if ((this->super_StaticRenderTest).m_w < 100) goto LAB_0011f54b;
      if ((this->super_StaticRenderTest).m_h < 0x16) {
LAB_0011f53f:
        pcVar3 = "y2+1 < m_h";
        goto LAB_0011f479;
      }
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,99,0x15);
      if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
         (0.01 <= ABS(vVar7.w + -1.0))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,99.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x63;
LAB_0012038e:
        iVar5 = 0x15;
        goto LAB_00120393;
      }
      if ((this->super_StaticRenderTest).m_w < 0x70) goto LAB_0011f557;
      if ((this->super_StaticRenderTest).m_h < 0x16) goto LAB_0011f53f;
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6f,0x15);
      if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
         ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,111.0);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
        poVar1 = std::operator<<(poVar1,")=");
        poVar2 = (ostream *)0x6f;
        goto LAB_0012038e;
      }
      uVar4 = 100;
      do {
        fVar6 = (float)(int)uVar4;
        if ((float)(this->super_StaticRenderTest).m_w <= fVar6) {
LAB_0011f4c1:
          pcVar3 = "x < m_w";
          goto LAB_0011f479;
        }
        if ((this->super_StaticRenderTest).m_h < 10) goto LAB_0011f533;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar4,9);
        if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
           ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,9.0);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)(ulong)uVar4;
          iVar5 = 9;
          goto LAB_0011f43b;
        }
        if ((float)(this->super_StaticRenderTest).m_w <= fVar6) goto LAB_0011f4c1;
        if ((this->super_StaticRenderTest).m_h < 0x16) goto LAB_0011f53f;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,uVar4,0x15);
        if ((((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) || (0.01 <= ABS(vVar7.z))) ||
           (0.01 <= ABS(vVar7.w + -1.0))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,21.0);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)(ulong)uVar4;
          iVar5 = 0x15;
          goto LAB_0011f43b;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x6f);
      iVar5 = 10;
LAB_0011ea5b:
      if ((this->super_StaticRenderTest).m_w < 100) goto LAB_0011f54b;
      fVar6 = (float)iVar5;
      if ((float)(this->super_StaticRenderTest).m_h <= fVar6) {
LAB_0011f4ca:
        pcVar3 = "y < m_h";
        goto LAB_0011f479;
      }
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,99,iVar5);
      if (((ABS(vVar7.x) < 0.01) && (ABS(vVar7.y) < 0.01)) &&
         ((ABS(vVar7.z) < 0.01 && (ABS(vVar7.w + -1.0) < 0.01)))) {
        if ((this->super_StaticRenderTest).m_w < 0x70) goto LAB_0011f557;
        if ((float)(this->super_StaticRenderTest).m_h <= fVar6) goto LAB_0011f4ca;
        vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x6f,iVar5);
        if (((0.01 <= ABS(vVar7.x)) || (0.01 <= ABS(vVar7.y))) ||
           ((0.01 <= ABS(vVar7.z) || (0.01 <= ABS(vVar7.w + -1.0))))) {
          poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,111.0);
          poVar1 = std::operator<<(poVar1,",");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
          poVar1 = std::operator<<(poVar1,")=");
          poVar2 = (ostream *)0x6f;
          goto LAB_0011f43b;
        }
        iVar5 = iVar5 + 1;
        if (iVar5 == 0x15) {
          if ((this->super_StaticRenderTest).m_w < 0x65) {
            pcVar3 = "100 < m_w";
          }
          else if ((this->super_StaticRenderTest).m_h < 0xb) {
            pcVar3 = "10 < m_h";
          }
          else {
            vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,100,10);
            if ((((ABS(vVar7.x + -0.64) < 0.01) && (ABS(vVar7.y) < 0.01)) && (ABS(vVar7.z) < 0.01))
               && (ABS(vVar7.w + -1.0) < 0.01)) {
              if ((this->super_StaticRenderTest).m_w < 0x66) {
                pcVar3 = "101 < m_w";
              }
              else if ((this->super_StaticRenderTest).m_h < 0xc) {
                pcVar3 = "11 < m_h";
              }
              else {
                vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x65,0xb);
                if (((ABS(vVar7.x) < 0.01) && (ABS(vVar7.y) < 0.01)) &&
                   ((ABS(vVar7.z + -0.64) < 0.01 && (ABS(vVar7.w + -1.0) < 0.01)))) {
                  if ((this->super_StaticRenderTest).m_w < 0x6f) {
                    pcVar3 = "110 < m_w";
                  }
                  else if ((this->super_StaticRenderTest).m_h < 0x15) {
                    pcVar3 = "20 < m_h";
                  }
                  else {
                    vVar7 = rengine::StaticRenderTest::pixel
                                      (&this->super_StaticRenderTest,0x6e,0x14);
                    if (((ABS(vVar7.x) < 0.01) && (ABS(vVar7.y) < 0.01)) &&
                       ((ABS(vVar7.z + -0.64) < 0.01 && (ABS(vVar7.w + -1.0) < 0.01)))) {
                      if ((this->super_StaticRenderTest).m_w < 0x6f) {
                        pcVar3 = "110 < m_w";
                      }
                      else if ((this->super_StaticRenderTest).m_h < 0xb) {
                        pcVar3 = "10 < m_h";
                      }
                      else {
                        vVar7 = rengine::StaticRenderTest::pixel
                                          (&this->super_StaticRenderTest,0x6e,10);
                        if ((((ABS(vVar7.x) < 0.01) && (ABS(vVar7.y) < 0.01)) &&
                            (ABS(vVar7.z) < 0.01)) && (ABS(vVar7.w + -1.0) < 0.01)) {
                          if ((this->super_StaticRenderTest).m_w < 0x65) {
                            pcVar3 = "100 < m_w";
                          }
                          else if ((this->super_StaticRenderTest).m_h < 0x15) {
                            pcVar3 = "20 < m_h";
                          }
                          else {
                            vVar7 = rengine::StaticRenderTest::pixel
                                              (&this->super_StaticRenderTest,100,0x14);
                            if (((ABS(vVar7.x) < 0.01) && (ABS(vVar7.y) < 0.01)) &&
                               ((ABS(vVar7.z) < 0.01 && (ABS(vVar7.w + -1.0) < 0.01)))) {
                              return;
                            }
                            poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                            *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                                 *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) &
                                 0xffffffb5 | 2;
                            poVar1 = (ostream *)std::ostream::operator<<(poVar1,100);
                            poVar1 = std::operator<<(poVar1,",");
                            poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14);
                            poVar1 = std::operator<<(poVar1,")=");
                            poVar2 = (ostream *)0x64;
                            vVar7 = rengine::StaticRenderTest::pixel
                                              (&this->super_StaticRenderTest,100,0x14);
                            poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
                            pcVar3 = "; expected=";
                            poVar1 = std::operator<<(poVar1,"; expected=");
                            poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                                         (vec4)(ZEXT816(0x3f80000000000000) << 0x40)
                                                        );
                            std::endl<char,std::char_traits<char>>(poVar1);
                            pcVar3 = "false";
                          }
                          __assert_fail(pcVar3,
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                        ,0xd0,"virtual void OpacityTextures::check()");
                        }
                        poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) &
                             0xffffffb5 | 2;
                        poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x6e);
                        poVar1 = std::operator<<(poVar1,",");
                        poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
                        poVar1 = std::operator<<(poVar1,")=");
                        poVar2 = (ostream *)0x6e;
                        vVar7 = rengine::StaticRenderTest::pixel
                                          (&this->super_StaticRenderTest,0x6e,10);
                        poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
                        pcVar3 = "; expected=";
                        poVar1 = std::operator<<(poVar1,"; expected=");
                        poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                                     (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
                        std::endl<char,std::char_traits<char>>(poVar1);
                        pcVar3 = "false";
                      }
                      __assert_fail(pcVar3,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                    ,0xcf,"virtual void OpacityTextures::check()");
                    }
                    poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5
                         | 2;
                    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x6e);
                    poVar1 = std::operator<<(poVar1,",");
                    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x14);
                    poVar1 = std::operator<<(poVar1,")=");
                    poVar2 = (ostream *)0x6e;
                    vVar7 = rengine::StaticRenderTest::pixel
                                      (&this->super_StaticRenderTest,0x6e,0x14);
                    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
                    pcVar3 = "; expected=";
                    poVar1 = std::operator<<(poVar1,"; expected=");
                    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                                 (vec4)(ZEXT816(0x3f8000003f23d70a) << 0x40));
                    std::endl<char,std::char_traits<char>>(poVar1);
                    pcVar3 = "false";
                  }
                  __assert_fail(pcVar3,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                                ,0xce,"virtual void OpacityTextures::check()");
                }
                poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
                *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                     *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x65);
                poVar1 = std::operator<<(poVar1,",");
                poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb);
                poVar1 = std::operator<<(poVar1,")=");
                poVar2 = (ostream *)0x65;
                vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,0x65,0xb);
                poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
                pcVar3 = "; expected=";
                poVar1 = std::operator<<(poVar1,"; expected=");
                poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                             (vec4)(ZEXT816(0x3f8000003f23d70a) << 0x40));
                std::endl<char,std::char_traits<char>>(poVar1);
                pcVar3 = "false";
              }
              __assert_fail(pcVar3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                            ,0xcd,"virtual void OpacityTextures::check()");
            }
            poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
            *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
                 *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,100);
            poVar1 = std::operator<<(poVar1,",");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
            poVar1 = std::operator<<(poVar1,")=");
            poVar2 = (ostream *)0x64;
            vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,100,10);
            poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
            pcVar3 = "; expected=";
            poVar1 = std::operator<<(poVar1,"; expected=");
            v_07.z = 0.0;
            v_07.w = 1.0;
            v_07.x = 0.64;
            v_07.y = 0.0;
            poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,v_07);
            std::endl<char,std::char_traits<char>>(poVar1);
            pcVar3 = "false";
          }
          __assert_fail(pcVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                        ,0xcc,"virtual void OpacityTextures::check()");
        }
        goto LAB_0011ea5b;
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"pixels differ: (");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,99.0);
      poVar1 = std::operator<<(poVar1,",");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar6);
      poVar1 = std::operator<<(poVar1,")=");
      poVar2 = (ostream *)0x63;
LAB_0011f43b:
      vVar7 = rengine::StaticRenderTest::pixel(&this->super_StaticRenderTest,(int)poVar2,iVar5);
    }
    poVar1 = rengine::operator<<((rengine *)poVar1,poVar2,vVar7);
    pcVar3 = "; expected=";
    poVar1 = std::operator<<(poVar1,"; expected=");
    poVar1 = rengine::operator<<((rengine *)poVar1,(ostream *)pcVar3,
                                 (vec4)(ZEXT816(0x3f80000000000000) << 0x40));
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar3 = "false";
  }
LAB_0011f479:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_render.cpp"
                ,0xcb,"virtual void OpacityTextures::check()");
}

Assistant:

void check() override {
        check_pixelsOutside(rect2d::fromXywh(10, 10, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(10, 10, vec4(0.5, 0, 0, 1));
        check_pixel(11, 10, vec4(0.5, 0, 0, 1));
        check_pixel(10, 11, vec4(0.5, 0, 0, 1));
        check_pixel(11, 11, vec4(0, 0, 0.5, 1));
        check_pixel(11, 12, vec4(0, 0, 0.5, 1));
        check_pixel(12, 11, vec4(0, 0, 0.5, 1));

        check_pixelsOutside(rect2d::fromXywh(31, 11, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(31, 11, vec4(0, 0.5, 0, 1));
        check_pixel(32, 11, vec4(0, 0.5, 0, 1));
        check_pixel(31, 12, vec4(0, 0.5, 0, 1));
        check_pixel(32, 12, vec4(0.5, 0, 0, 1));
        check_pixel(33, 12, vec4(0.5, 0, 0, 1));
        check_pixel(32, 13, vec4(0.5, 0, 0, 1));

        check_pixelsOutside(rect2d::fromXywh(100, 10, 11, 11), vec4(0, 0, 0, 1));
        check_pixel(100, 10, vec4(0.64, 0, 0, 1));
        check_pixel(101, 11, vec4(0, 0, 0.64, 1));
        check_pixel(110, 20, vec4(0, 0, 0.64, 1));
        check_pixel(110, 10, vec4(0, 0, 0, 1));
        check_pixel(100, 20, vec4(0, 0, 0, 1));
    }